

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool __thiscall anon_unknown.dwarf_354e9::CLIncludeParser::ProcessLine(CLIncludeParser *this)

{
  ofstream *poVar1;
  string_view str;
  bool bVar2;
  long lVar3;
  size_type sVar4;
  ostream *poVar5;
  void *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  cmCMakePath local_b8;
  string local_90;
  string_view local_60;
  undefined1 local_50 [8];
  string path;
  CLIncludeParser *this_local;
  
  str = (string_view)
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((string *)&(this->super_LineParser).Line);
  path.field_2._8_8_ = (this->IncludePrefix)._M_len;
  bVar2 = cmHasPrefix(str,this->IncludePrefix);
  if (bVar2) {
    lVar3 = std::__cxx11::string::c_str();
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->IncludePrefix);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,(char *)(lVar3 + sVar4));
    cmTrimWhitespace_abi_cxx11_((string *)local_50,local_60);
    cmSystemTools::ConvertToLongPath((string *)local_50);
    poVar1 = this->DepFile;
    std::__cxx11::string::string((string *)&local_d8,(string *)local_50);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&local_b8,&local_d8,generic_format);
    cmCMakePath::GenericString_abi_cxx11_(&local_90,&local_b8);
    poVar5 = std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)&local_90);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_90);
    cmCMakePath::~cmCMakePath(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    poVar5 = std::operator<<(this->Output,(string *)&(this->super_LineParser).Line);
    this_00 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (cmHasPrefix(this->Line, this->IncludePrefix)) {
      auto path =
        cmTrimWhitespace(this->Line.c_str() + this->IncludePrefix.size());
      cmSystemTools::ConvertToLongPath(path);
      this->DepFile << cmCMakePath(path).GenericString() << std::endl;
    } else {
      this->Output << this->Line << std::endl << std::flush;
    }

    return true;
  }